

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MultMatrix(float *A)

{
  float *result_00;
  float *result;
  float *A_local;
  
  result_00 = GPU_GetCurrentMatrix();
  if (result_00 != (float *)0x0) {
    GPU_FlushBlitBuffer();
    GPU_MultiplyAndAssign(result_00,A);
  }
  return;
}

Assistant:

void GPU_MultMatrix(const float* A)
{
    float* result = GPU_GetCurrentMatrix();
    if(result == NULL)
        return;
	GPU_FlushBlitBuffer();
	// BIG FIXME: All of these matrix stack manipulators should be flushing the blit buffer.
	// A better solution would be to minimize the matrix stack API and make it clear that MultMatrix flushes.
    GPU_MultiplyAndAssign(result, A);
}